

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDefaultSoftBodySolver.cpp
# Opt level: O1

void __thiscall btDefaultSoftBodySolver::updateSoftBodies(btDefaultSoftBodySolver *this)

{
  int iVar1;
  btSoftBody *this_00;
  long lVar2;
  
  if (0 < (this->m_softBodySet).m_size) {
    lVar2 = 0;
    do {
      this_00 = (this->m_softBodySet).m_data[lVar2];
      iVar1 = (this_00->super_btCollisionObject).m_activationState1;
      if ((iVar1 != 2) && (iVar1 != 5)) {
        btSoftBody::integrateMotion(this_00);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->m_softBodySet).m_size);
  }
  return;
}

Assistant:

void btDefaultSoftBodySolver::updateSoftBodies( )
{
	for ( int i=0; i < m_softBodySet.size(); i++)
	{
		btSoftBody*	psb=(btSoftBody*)m_softBodySet[i];
		if (psb->isActive())
		{
			psb->integrateMotion();	
		}
	}
}